

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O2

String * Rml::StringUtilities::DecodeRml(String *__return_storage_ptr__,String *s)

{
  ulong uVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  ulong uVar4;
  long lVar5;
  Character character;
  Character character_00;
  byte bVar6;
  char cVar7;
  char *pcVar8;
  char *end;
  String local_70;
  String tmp;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar8 = (char *)0x0;
LAB_002c3ede:
  if ((char *)s->_M_string_length <= pcVar8) {
    return __return_storage_ptr__;
  }
  pcVar2 = (s->_M_dataplus)._M_p;
  if (pcVar8[(long)pcVar2] != '&') goto LAB_002c4186;
  cVar7 = pcVar8[(long)(pcVar2 + 1)];
  if (cVar7 == '#') {
    if (pcVar8[(long)(pcVar2 + 2)] != 'x') {
      for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
        cVar7 = pcVar8[(long)(pcVar2 + lVar5 + 2)];
        if (9 < (byte)(cVar7 - 0x30U)) {
          if (lVar5 != 0) goto LAB_002c4108;
          goto LAB_002c4186;
        }
      }
      cVar7 = pcVar8[(long)(pcVar2 + 10)];
LAB_002c4108:
      if (cVar7 == ';') {
        ::std::__cxx11::string::substr((ulong)&tmp,(ulong)s);
        _Var3 = tmp._M_dataplus;
        uVar4 = strtoul(tmp._M_dataplus._M_p,&end,10);
        uVar1 = uVar4 + 1;
        if (1 < uVar1) {
          ToUTF8_abi_cxx11_(&local_70,(StringUtilities *)(uVar4 & 0xffffffff),character_00);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&local_70);
          pcVar8 = end + (long)(pcVar8 + (3 - (long)_Var3._M_p));
        }
        ::std::__cxx11::string::~string((string *)&tmp);
        goto joined_r0x002c4180;
      }
      goto LAB_002c4186;
    }
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      bVar6 = pcVar8[(long)(pcVar2 + lVar5 + 3)];
      if ((9 < (byte)(bVar6 - 0x30)) &&
         ((0x25 < bVar6 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar6 - 0x41) & 0x3f) & 1) == 0)))) {
        if (lVar5 != 0) goto LAB_002c407c;
        goto LAB_002c4186;
      }
    }
    bVar6 = pcVar8[(long)(pcVar2 + 0xb)];
LAB_002c407c:
    if (bVar6 != 0x3b) goto LAB_002c4186;
    ::std::__cxx11::string::substr((ulong)&tmp,(ulong)s);
    _Var3 = tmp._M_dataplus;
    uVar4 = strtoul(tmp._M_dataplus._M_p,&end,0x10);
    uVar1 = uVar4 + 1;
    if (1 < uVar1) {
      ToUTF8_abi_cxx11_(&local_70,(StringUtilities *)(uVar4 & 0xffffffff),character);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_70);
      pcVar8 = end + (long)(pcVar8 + (4 - (long)_Var3._M_p));
    }
    ::std::__cxx11::string::~string((string *)&tmp);
joined_r0x002c4180:
    if (1 < uVar1) goto LAB_002c3ede;
  }
  else if (cVar7 == 'a') {
    if (((pcVar8[(long)(pcVar2 + 2)] == 'm') && (pcVar8[(long)(pcVar2 + 3)] == 'p')) &&
       (pcVar8[(long)(pcVar2 + 4)] == ';')) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      pcVar8 = pcVar8 + 5;
      goto LAB_002c3ede;
    }
  }
  else if (cVar7 == 'g') {
    if ((pcVar8[(long)(pcVar2 + 2)] == 't') && (pcVar8[(long)(pcVar2 + 3)] == ';')) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_002c3ff9:
      pcVar8 = pcVar8 + 4;
      goto LAB_002c3ede;
    }
  }
  else {
    if (cVar7 != 'l') {
      if ((((cVar7 != 'q') || (pcVar8[(long)(pcVar2 + 2)] != 'u')) ||
          (pcVar8[(long)(pcVar2 + 3)] != 'o')) ||
         ((pcVar8[(long)(pcVar2 + 4)] != 't' || (pcVar8[(long)(pcVar2 + 5)] != ';'))))
      goto LAB_002c4186;
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      pcVar8 = pcVar8 + 6;
      goto LAB_002c3ede;
    }
    if ((pcVar8[(long)(pcVar2 + 2)] == 't') && (pcVar8[(long)(pcVar2 + 3)] == ';')) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_002c3ff9;
    }
  }
LAB_002c4186:
  ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
  pcVar8 = pcVar8 + 1;
  goto LAB_002c3ede;
}

Assistant:

String StringUtilities::DecodeRml(const String& s)
{
	String result;
	result.reserve(s.size());
	for (size_t i = 0; i < s.size();)
	{
		if (s[i] == '&')
		{
			if (s[i + 1] == 'l' && s[i + 2] == 't' && s[i + 3] == ';')
			{
				result += "<";
				i += 4;
				continue;
			}
			else if (s[i + 1] == 'g' && s[i + 2] == 't' && s[i + 3] == ';')
			{
				result += ">";
				i += 4;
				continue;
			}
			else if (s[i + 1] == 'a' && s[i + 2] == 'm' && s[i + 3] == 'p' && s[i + 4] == ';')
			{
				result += "&";
				i += 5;
				continue;
			}
			else if (s[i + 1] == 'q' && s[i + 2] == 'u' && s[i + 3] == 'o' && s[i + 4] == 't' && s[i + 5] == ';')
			{
				result += "\"";
				i += 6;
				continue;
			}
			else if (s[i + 1] == '#')
			{
				size_t start = i + 2;
				if (s[i + 2] == 'x')
				{
					start++;
					size_t j = 0;
					for (; j < 8; j++)
					{
						const auto& c = s[start + j];
						if (!((c >= '0' && c <= '9') || (c >= 'a' && c <= 'f') || (c >= 'A' && c <= 'F')))
							break;
					}

					if (j > 0 && s[start + j] == ';')
					{
						String tmp = s.substr(start, j);
						const char* begin = tmp.c_str();
						char* end;
						unsigned long code_point = strtoul(begin, &end, 16);
						if (code_point != 0 && code_point != ULONG_MAX)
						{
							result += ToUTF8(static_cast<Character>(code_point));
							i = start + (end - begin) + 1;
							continue;
						}
					}
				}
				else
				{
					size_t j = 0;
					for (; j < 8; j++)
					{
						const auto& c = s[start + j];
						if (!(c >= '0' && c <= '9'))
							break;
					}

					if (j > 0 && s[start + j] == ';')
					{
						String tmp = s.substr(start, j);
						const char* begin = tmp.c_str();
						char* end;
						unsigned long code_point = strtoul(begin, &end, 10);
						if (code_point != 0 && code_point != ULONG_MAX)
						{
							result += ToUTF8(static_cast<Character>(code_point));
							i = start + (end - begin) + 1;
							continue;
						}
					}
				}
			}
		}
		result += s[i];
		i += 1;
	}
	return result;
}